

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::createEmptyTexture
          (anon_unknown_0 *this,deUint32 format,TextureType type,IVec3 *textureSize,int numLevels,
          int lodBase,Sampler *sampler)

{
  long *plVar1;
  TextureCube *pTVar2;
  TextureBinding *pTVar3;
  long *plVar4;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *extraout_RDX_02;
  SharedPtrStateBase *extraout_RDX_03;
  SharedPtrStateBase *extraout_RDX_04;
  SharedPtrStateBase *extraout_RDX_05;
  SharedPtrStateBase *extraout_RDX_06;
  SharedPtrStateBase *pSVar5;
  int iVar6;
  int *piVar7;
  int face;
  CubeFace face_00;
  TextureBindingSp TVar8;
  MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> texture;
  TextureFormat texFmt;
  UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> local_48;
  TextureFormat local_38;
  
  local_38 = glu::mapGLInternalFormat(format);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  pSVar5 = extraout_RDX;
  switch(type) {
  case TEXTURETYPE_1D:
    pTVar2 = (TextureCube *)operator_new(0x50);
    tcu::Texture1D::Texture1D((Texture1D *)pTVar2,&local_38,textureSize->m_data[0]);
    local_48.m_data.ptr = pTVar2;
    if (0 < numLevels) {
      iVar6 = 0;
      do {
        tcu::Texture1D::allocLevel((Texture1D *)local_48.m_data.ptr,iVar6);
        iVar6 = iVar6 + 1;
      } while (numLevels != iVar6);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar3,(Texture1D *)pTVar2,sampler);
    plVar4 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar4 + 1) = 0;
    *(undefined4 *)((long)plVar4 + 0xc) = 0;
    *plVar4 = (long)&PTR__SharedPtrState_00cf6920;
    plVar4[2] = (long)pTVar3;
    *(undefined4 *)(plVar4 + 1) = 1;
    *(undefined4 *)((long)plVar4 + 0xc) = 1;
    *(TextureBinding **)this = pTVar3;
    *(long **)(this + 8) = plVar4;
    LOCK();
    *(int *)(plVar4 + 1) = (int)plVar4[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
    UNLOCK();
    piVar7 = (int *)((long)plVar4 + 0xc);
    LOCK();
    plVar1 = plVar4 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
    }
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      (**(code **)(*plVar4 + 8))(plVar4);
    }
    de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::reset
              ((UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)&local_48);
    pSVar5 = extraout_RDX_00;
    break;
  case TEXTURETYPE_2D:
    pTVar2 = (TextureCube *)operator_new(0x50);
    tcu::Texture2D::Texture2D
              ((Texture2D *)pTVar2,&local_38,textureSize->m_data[0],textureSize->m_data[1]);
    local_48.m_data.ptr = pTVar2;
    if (0 < numLevels) {
      iVar6 = 0;
      do {
        tcu::Texture2D::allocLevel((Texture2D *)local_48.m_data.ptr,iVar6);
        iVar6 = iVar6 + 1;
      } while (numLevels != iVar6);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar3,(Texture2D *)pTVar2,sampler);
    plVar4 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar4 + 1) = 0;
    *(undefined4 *)((long)plVar4 + 0xc) = 0;
    *plVar4 = (long)&PTR__SharedPtrState_00cf6920;
    plVar4[2] = (long)pTVar3;
    *(undefined4 *)(plVar4 + 1) = 1;
    *(undefined4 *)((long)plVar4 + 0xc) = 1;
    *(TextureBinding **)this = pTVar3;
    *(long **)(this + 8) = plVar4;
    LOCK();
    *(int *)(plVar4 + 1) = (int)plVar4[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
    UNLOCK();
    piVar7 = (int *)((long)plVar4 + 0xc);
    LOCK();
    plVar1 = plVar4 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
    }
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      (**(code **)(*plVar4 + 8))(plVar4);
    }
    de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
              ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&local_48);
    pSVar5 = extraout_RDX_04;
    break;
  case TEXTURETYPE_3D:
    pTVar2 = (TextureCube *)operator_new(0x58);
    tcu::Texture3D::Texture3D
              ((Texture3D *)pTVar2,&local_38,textureSize->m_data[0],textureSize->m_data[1],
               textureSize->m_data[2]);
    local_48.m_data.ptr = pTVar2;
    if (0 < numLevels) {
      iVar6 = 0;
      do {
        tcu::Texture3D::allocLevel((Texture3D *)local_48.m_data.ptr,iVar6);
        iVar6 = iVar6 + 1;
      } while (numLevels != iVar6);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar3,(Texture3D *)pTVar2,sampler);
    plVar4 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar4 + 1) = 0;
    *(undefined4 *)((long)plVar4 + 0xc) = 0;
    *plVar4 = (long)&PTR__SharedPtrState_00cf6920;
    plVar4[2] = (long)pTVar3;
    *(undefined4 *)(plVar4 + 1) = 1;
    *(undefined4 *)((long)plVar4 + 0xc) = 1;
    *(TextureBinding **)this = pTVar3;
    *(long **)(this + 8) = plVar4;
    LOCK();
    *(int *)(plVar4 + 1) = (int)plVar4[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
    UNLOCK();
    piVar7 = (int *)((long)plVar4 + 0xc);
    LOCK();
    plVar1 = plVar4 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
    }
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      (**(code **)(*plVar4 + 8))(plVar4);
    }
    de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::reset
              ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&local_48);
    pSVar5 = extraout_RDX_02;
    break;
  case TEXTURETYPE_CUBE_MAP:
    pTVar2 = (TextureCube *)operator_new(0x168);
    tcu::TextureCube::TextureCube(pTVar2,&local_38,textureSize->m_data[0]);
    local_48.m_data.ptr = pTVar2;
    if (0 < numLevels) {
      iVar6 = 0;
      do {
        face_00 = CUBEFACE_NEGATIVE_X;
        do {
          tcu::TextureCube::allocLevel(local_48.m_data.ptr,face_00,iVar6);
          face_00 = face_00 + CUBEFACE_POSITIVE_X;
        } while (face_00 != CUBEFACE_LAST);
        iVar6 = iVar6 + 1;
      } while (iVar6 != numLevels);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar3,pTVar2,sampler);
    plVar4 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar4 + 1) = 0;
    *(undefined4 *)((long)plVar4 + 0xc) = 0;
    *plVar4 = (long)&PTR__SharedPtrState_00cf6920;
    plVar4[2] = (long)pTVar3;
    *(undefined4 *)(plVar4 + 1) = 1;
    *(undefined4 *)((long)plVar4 + 0xc) = 1;
    *(TextureBinding **)this = pTVar3;
    *(long **)(this + 8) = plVar4;
    LOCK();
    *(int *)(plVar4 + 1) = (int)plVar4[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
    UNLOCK();
    piVar7 = (int *)((long)plVar4 + 0xc);
    LOCK();
    plVar1 = plVar4 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
    }
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      (**(code **)(*plVar4 + 8))(plVar4);
    }
    de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::reset
              (&local_48);
    pSVar5 = extraout_RDX_03;
    break;
  case TEXTURETYPE_1D_ARRAY:
    pTVar2 = (TextureCube *)operator_new(0x50);
    tcu::Texture1DArray::Texture1DArray
              ((Texture1DArray *)pTVar2,&local_38,textureSize->m_data[0],textureSize->m_data[2]);
    local_48.m_data.ptr = pTVar2;
    if (0 < numLevels) {
      iVar6 = 0;
      do {
        tcu::Texture1DArray::allocLevel((Texture1DArray *)local_48.m_data.ptr,iVar6);
        iVar6 = iVar6 + 1;
      } while (numLevels != iVar6);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar3,(Texture1DArray *)pTVar2,sampler);
    plVar4 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar4 + 1) = 0;
    *(undefined4 *)((long)plVar4 + 0xc) = 0;
    *plVar4 = (long)&PTR__SharedPtrState_00cf6920;
    plVar4[2] = (long)pTVar3;
    *(undefined4 *)(plVar4 + 1) = 1;
    *(undefined4 *)((long)plVar4 + 0xc) = 1;
    *(TextureBinding **)this = pTVar3;
    *(long **)(this + 8) = plVar4;
    LOCK();
    *(int *)(plVar4 + 1) = (int)plVar4[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
    UNLOCK();
    piVar7 = (int *)((long)plVar4 + 0xc);
    LOCK();
    plVar1 = plVar4 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
    }
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      (**(code **)(*plVar4 + 8))(plVar4);
    }
    de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::reset
              ((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)
               &local_48);
    pSVar5 = extraout_RDX_01;
    break;
  case TEXTURETYPE_2D_ARRAY:
    pTVar2 = (TextureCube *)operator_new(0x58);
    tcu::Texture2DArray::Texture2DArray
              ((Texture2DArray *)pTVar2,&local_38,textureSize->m_data[0],textureSize->m_data[1],
               textureSize->m_data[2]);
    local_48.m_data.ptr = pTVar2;
    if (0 < numLevels) {
      iVar6 = 0;
      do {
        tcu::Texture2DArray::allocLevel((Texture2DArray *)local_48.m_data.ptr,iVar6);
        iVar6 = iVar6 + 1;
      } while (numLevels != iVar6);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar3,(Texture2DArray *)pTVar2,sampler);
    plVar4 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar4 + 1) = 0;
    *(undefined4 *)((long)plVar4 + 0xc) = 0;
    *plVar4 = (long)&PTR__SharedPtrState_00cf6920;
    plVar4[2] = (long)pTVar3;
    *(undefined4 *)(plVar4 + 1) = 1;
    *(undefined4 *)((long)plVar4 + 0xc) = 1;
    *(TextureBinding **)this = pTVar3;
    *(long **)(this + 8) = plVar4;
    LOCK();
    *(int *)(plVar4 + 1) = (int)plVar4[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
    UNLOCK();
    piVar7 = (int *)((long)plVar4 + 0xc);
    LOCK();
    plVar1 = plVar4 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
    }
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      (**(code **)(*plVar4 + 8))(plVar4);
    }
    de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::reset
              ((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
               &local_48);
    pSVar5 = extraout_RDX_05;
    break;
  case TEXTURETYPE_CUBE_ARRAY:
    pTVar2 = (TextureCube *)operator_new(0x50);
    tcu::TextureCubeArray::TextureCubeArray
              ((TextureCubeArray *)pTVar2,&local_38,textureSize->m_data[0],textureSize->m_data[2]);
    local_48.m_data.ptr = pTVar2;
    if (0 < numLevels) {
      iVar6 = 0;
      do {
        tcu::TextureCubeArray::allocLevel((TextureCubeArray *)local_48.m_data.ptr,iVar6);
        iVar6 = iVar6 + 1;
      } while (numLevels != iVar6);
    }
    pTVar3 = (TextureBinding *)operator_new(0x68);
    pTVar2 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar3,(TextureCubeArray *)pTVar2,sampler);
    plVar4 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar4 + 1) = 0;
    *(undefined4 *)((long)plVar4 + 0xc) = 0;
    *plVar4 = (long)&PTR__SharedPtrState_00cf6920;
    plVar4[2] = (long)pTVar3;
    *(undefined4 *)(plVar4 + 1) = 1;
    *(undefined4 *)((long)plVar4 + 0xc) = 1;
    *(TextureBinding **)this = pTVar3;
    *(long **)(this + 8) = plVar4;
    LOCK();
    *(int *)(plVar4 + 1) = (int)plVar4[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
    UNLOCK();
    piVar7 = (int *)((long)plVar4 + 0xc);
    LOCK();
    plVar1 = plVar4 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
    }
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      (**(code **)(*plVar4 + 8))(plVar4);
    }
    de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
    reset((UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)&local_48
         );
    pSVar5 = extraout_RDX_06;
  }
  pTVar3 = *(TextureBinding **)this;
  (pTVar3->m_params).baseMipLevel = lodBase;
  (pTVar3->m_params).componentMapping.r = VK_COMPONENT_SWIZZLE_R;
  (pTVar3->m_params).componentMapping.g = VK_COMPONENT_SWIZZLE_G;
  (pTVar3->m_params).componentMapping.b = VK_COMPONENT_SWIZZLE_B;
  (pTVar3->m_params).componentMapping.a = VK_COMPONENT_SWIZZLE_A;
  (pTVar3->m_params).samples = VK_SAMPLE_COUNT_1_BIT;
  (pTVar3->m_params).initialization = INIT_UPLOAD_DATA;
  TVar8.m_state = pSVar5;
  TVar8.m_ptr = pTVar3;
  return TVar8;
}

Assistant:

static TextureBindingSp createEmptyTexture (deUint32				format,
											TextureType				type,
											const tcu::IVec3&		textureSize,
											int						numLevels,
											int						lodBase,
											const tcu::Sampler&		sampler)
{
	const tcu::TextureFormat			texFmt				= glu::mapGLInternalFormat(format);
	const TextureBinding::Parameters	params				(lodBase);
	TextureBindingSp					textureBinding;

	switch (type)
	{

		case TEXTURETYPE_1D:
		{
			de::MovePtr<tcu::Texture1D>			texture		(new tcu::Texture1D(texFmt, textureSize.x()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_2D:
		{
			de::MovePtr<tcu::Texture2D>			texture		(new tcu::Texture2D(texFmt, textureSize.x(), textureSize.y()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_3D:
		{
			de::MovePtr<tcu::Texture3D>			texture		(new tcu::Texture3D(texFmt, textureSize.x(), textureSize.y(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			de::MovePtr<tcu::TextureCube>		texture		(new tcu::TextureCube(texFmt, textureSize.x()));

			for (int level = 0; level < numLevels; level++)
				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
					texture->allocLevel((tcu::CubeFace)face, level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_1D_ARRAY:
		{
			de::MovePtr<tcu::Texture1DArray>	texture		(new tcu::Texture1DArray(texFmt, textureSize.x(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_2D_ARRAY:
		{
			de::MovePtr<tcu::Texture2DArray>	texture		(new tcu::Texture2DArray(texFmt, textureSize.x(), textureSize.y(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_CUBE_ARRAY:
		{
			de::MovePtr<tcu::TextureCubeArray>	texture		(new tcu::TextureCubeArray(texFmt, textureSize.x(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	textureBinding->setParameters(params);
	return textureBinding;
}